

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall basisu::vector<basisu::image_stats>::~vector(vector<basisu::image_stats> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  image_stats *__ptr;
  long lVar2;
  
  __ptr = this->m_p;
  if (__ptr != (image_stats *)0x0) {
    if ((ulong)this->m_size != 0) {
      lVar2 = (ulong)this->m_size * 0x68;
      paVar1 = &(__ptr->m_filename).field_2;
      do {
        if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar1->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar1->_M_allocated_capacity)[-2],
                          paVar1->_M_allocated_capacity + 1);
        }
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar1->_M_allocated_capacity + 0xd);
        lVar2 = lVar2 + -0x68;
      } while (lVar2 != 0);
      __ptr = this->m_p;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }